

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.cpp
# Opt level: O2

double Imath_3_2::erand48(ushort *__xsubi)

{
  anon_unknown_0::rand48Next(__xsubi);
  return (double)((ulong)(__xsubi[2] >> 0xc) | (ulong)__xsubi[2] << 0x24 | (ulong)__xsubi[1] << 0x14
                  | (ulong)*__xsubi << 4 | 0x3ff0000000000000) + -1.0;
}

Assistant:

double
erand48 (unsigned short state[3])
{
    rand48Next (state);

    union
    {
        double   d;
        uint64_t i;
    } u;

    // clang-format off
    u.i = (uint64_t (0x3ff)    << 52) |	// sign and exponent
	  (uint64_t (state[2]) << 36) |	// significand
	  (uint64_t (state[1]) << 20) |
	  (uint64_t (state[0]) <<  4) |
	  (uint64_t (state[2]) >> 12);
    // clang-format on

    return u.d - 1;
}